

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double_sprintf<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          longdouble value,format_specs *spec,basic_buffer<char> *buffer)

{
  undefined8 this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  type tVar4;
  size_t sVar5;
  char *buffer_00;
  char_type *pcVar6;
  uint n;
  int result;
  size_t buffer_size;
  char_type *start;
  char_type *format_ptr;
  char_type format [10];
  basic_buffer<char> *buffer_local;
  format_specs *spec_local;
  longdouble value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  
  format._2_8_ = buffer;
  sVar5 = internal::basic_buffer<char>::capacity(buffer);
  if (sVar5 != 0) {
    start = (char_type *)((long)&format_ptr + 7);
    format_ptr._6_1_ = 0x25;
    bVar1 = basic_format_specs<char>::flag(spec,8);
    if (bVar1) {
      pcVar6 = start + 1;
      *start = '#';
      start = pcVar6;
    }
    iVar3 = basic_format_specs<char>::precision(spec);
    if (-1 < iVar3) {
      pcVar6 = start + 1;
      *start = '.';
      start = start + 2;
      *pcVar6 = '*';
    }
    append_float_length(this,&start,value);
    cVar2 = basic_format_specs<char>::type(spec);
    *start = cVar2;
    start[1] = '\0';
    start = start + 1;
    while( true ) {
      while( true ) {
        sVar5 = internal::basic_buffer<char>::capacity((basic_buffer<char> *)format._2_8_);
        buffer_00 = internal::basic_buffer<char>::operator[]((basic_buffer<char> *)format._2_8_,0);
        iVar3 = basic_format_specs<char>::precision(spec);
        iVar3 = internal::char_traits<char>::format_float<long_double>
                          (buffer_00,sVar5,(char *)((long)&format_ptr + 6),iVar3,value);
        this_00 = format._2_8_;
        if (-1 < iVar3) break;
        sVar5 = internal::basic_buffer<char>::capacity((basic_buffer<char> *)format._2_8_);
        internal::basic_buffer<char>::reserve((basic_buffer<char> *)this_00,sVar5 + 1);
      }
      tVar4 = internal::to_unsigned<int>(iVar3);
      sVar5 = internal::basic_buffer<char>::capacity((basic_buffer<char> *)format._2_8_);
      if (tVar4 < sVar5) break;
      internal::basic_buffer<char>::reserve((basic_buffer<char> *)format._2_8_,(ulong)(tVar4 + 1));
    }
    internal::basic_buffer<char>::resize((basic_buffer<char> *)format._2_8_,(ulong)tVar4);
    return;
  }
  __assert_fail("(buffer.capacity() != 0) && \"empty buffer\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/format.h"
                ,0xb6e,
                "void fmt::basic_writer<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>::write_double_sprintf(T, const format_specs &, internal::basic_buffer<char_type> &) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<char>>, T = long double]"
               );
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}